

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::TestFactoryImpl<(anonymous_namespace)::ExternalFrameBufferTest_NullRealloc_Test>
::CreateTest(TestFactoryImpl<(anonymous_namespace)::ExternalFrameBufferTest_NullRealloc_Test> *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x40);
  anon_unknown.dwarf_79f906::ExternalFrameBufferTest_NullRealloc_Test::
  ExternalFrameBufferTest_NullRealloc_Test((ExternalFrameBufferTest_NullRealloc_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }